

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O2

_Bool ssh2_connection_get_specials(PacketProtocolLayer *ppl,add_special_fn_t add_special,void *ctx)

{
  _Bool _Var1;
  
  _Var1 = (mainchan *)ppl[-2].vt != (mainchan *)0x0;
  if (_Var1) {
    mainchan_get_specials((mainchan *)ppl[-2].vt,add_special,ctx);
  }
  if ((ppl->remote_bugs & 0x200) == 0) {
    if (_Var1) {
      (*add_special)(ctx,(char *)0x0,SS_SEP,0);
    }
    (*add_special)(ctx,"IGNORE message",SS_NOP,0);
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

static bool ssh2_connection_get_specials(
    PacketProtocolLayer *ppl, add_special_fn_t add_special, void *ctx)
{
    struct ssh2_connection_state *s =
        container_of(ppl, struct ssh2_connection_state, ppl);
    bool toret = false;

    if (s->mainchan) {
        mainchan_get_specials(s->mainchan, add_special, ctx);
        toret = true;
    }

    /*
     * Don't bother offering IGNORE if we've decided the remote
     * won't cope with it, since we wouldn't bother sending it if
     * asked anyway.
     */
    if (!(s->ppl.remote_bugs & BUG_CHOKES_ON_SSH2_IGNORE)) {
        if (toret)
            add_special(ctx, NULL, SS_SEP, 0);

        add_special(ctx, "IGNORE message", SS_NOP, 0);
        toret = true;
    }

    return toret;
}